

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.c
# Opt level: O0

int epoll_apply_one_change(event_base *base,epollop *epollop,event_change *ch)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  short sVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  int *piVar12;
  uint local_4c;
  int idx;
  int events;
  int op;
  epoll_event epev;
  event_change *ch_local;
  epollop *epollop_local;
  event_base *base_local;
  
  uVar5 = ch->close_change & 3 | (ch->read_change & 3) << 2 | (ch->write_change & 3) << 4 |
          ((int)ch->old_events & 6U) << 5 | ((int)ch->old_events & 0x80U) << 1;
  iVar7 = epoll_op_table[(int)uVar5].op;
  local_4c = epoll_op_table[(int)uVar5].events;
  epev.data = (epoll_data_t)ch;
  if (local_4c == 0) {
    if (iVar7 != 0) {
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/epoll.c"
                 ,0x118,"op == 0","epoll_apply_one_change");
    }
    base_local._4_4_ = 0;
  }
  else {
    if (((ch->read_change | ch->write_change) & 0x20) != 0) {
      local_4c = local_4c | 0x80000000;
    }
    memset(&events,0,0xc);
    op = *epev.data.ptr;
    events = local_4c;
    iVar6 = epoll_ctl(epollop->epfd,iVar7,*epev.data.ptr,(epoll_event *)&events);
    if (iVar6 == 0) {
      if (event_debug_logging_mask_ != 0) {
        pcVar8 = epoll_op_to_string(iVar7);
        iVar7 = events;
        uVar5 = *epev.data.ptr;
        sVar4 = *(short *)(epev.data.u64 + 4);
        bVar1 = *(byte *)(epev.data.u64 + 6);
        pcVar9 = change_to_string((uint)*(byte *)(epev.data.u64 + 6));
        bVar2 = *(byte *)(epev.data.u64 + 7);
        pcVar10 = change_to_string((uint)*(byte *)(epev.data.u64 + 7));
        bVar3 = *(byte *)(epev.data.u64 + 8);
        pcVar11 = change_to_string((uint)*(byte *)(epev.data.u64 + 8));
        event_debugx_("Epoll %s(%d) on fd %d okay. Old events were %d; read change was %d (%s); write change was %d (%s); close change was %d (%s)"
                      ,pcVar8,(ulong)(uint)iVar7,(ulong)uVar5,(ulong)(uint)(int)sVar4,(ulong)bVar1,
                      pcVar9,(uint)bVar2,pcVar10,(uint)bVar3,pcVar11);
      }
      base_local._4_4_ = 0;
    }
    else {
      if (iVar7 == 1) {
        piVar12 = __errno_location();
        if (*piVar12 == 0x11) {
          iVar7 = epoll_ctl(epollop->epfd,3,*epev.data.ptr,(epoll_event *)&events);
          if (iVar7 == -1) {
            event_warn("Epoll ADD(%d) on %d retried as MOD; that failed too",(ulong)(uint)events,
                       (ulong)*epev.data.ptr);
            return -1;
          }
          if (event_debug_logging_mask_ != 0) {
            event_debugx_("Epoll ADD(%d) on %d retried as MOD; succeeded.",(ulong)(uint)events,
                          (ulong)*epev.data.ptr);
          }
          return 0;
        }
      }
      else if (iVar7 == 2) {
        piVar12 = __errno_location();
        if (((*piVar12 == 2) || (piVar12 = __errno_location(), *piVar12 == 9)) ||
           (piVar12 = __errno_location(), *piVar12 == 1)) {
          iVar7 = events;
          if (event_debug_logging_mask_ != 0) {
            uVar5 = *epev.data.ptr;
            piVar12 = __errno_location();
            pcVar8 = strerror(*piVar12);
            event_debugx_("Epoll DEL(%d) on fd %d gave %s: DEL was unnecessary.",(ulong)(uint)iVar7,
                          (ulong)uVar5,pcVar8);
          }
          return 0;
        }
      }
      else if ((iVar7 == 3) && (piVar12 = __errno_location(), *piVar12 == 2)) {
        iVar7 = epoll_ctl(epollop->epfd,1,*epev.data.ptr,(epoll_event *)&events);
        if (iVar7 == -1) {
          event_warn("Epoll MOD(%d) on %d retried as ADD; that failed too",(ulong)(uint)events,
                     (ulong)*epev.data.ptr);
          return -1;
        }
        if (event_debug_logging_mask_ != 0) {
          event_debugx_("Epoll MOD(%d) on %d retried as ADD; succeeded.",(ulong)(uint)events,
                        (ulong)*epev.data.ptr);
        }
        return 0;
      }
      pcVar8 = epoll_op_to_string(iVar7);
      iVar7 = events;
      uVar5 = *epev.data.ptr;
      sVar4 = *(short *)(epev.data.u64 + 4);
      bVar1 = *(byte *)(epev.data.u64 + 6);
      pcVar9 = change_to_string((uint)*(byte *)(epev.data.u64 + 6));
      bVar2 = *(byte *)(epev.data.u64 + 7);
      pcVar10 = change_to_string((uint)*(byte *)(epev.data.u64 + 7));
      bVar3 = *(byte *)(epev.data.u64 + 8);
      pcVar11 = change_to_string((uint)*(byte *)(epev.data.u64 + 8));
      event_warn("Epoll %s(%d) on fd %d failed. Old events were %d; read change was %d (%s); write change was %d (%s); close change was %d (%s)"
                 ,pcVar8,(ulong)(uint)iVar7,(ulong)uVar5,(ulong)(uint)(int)sVar4,(ulong)bVar1,pcVar9
                 ,(uint)bVar2,pcVar10,(uint)bVar3,pcVar11);
      base_local._4_4_ = -1;
    }
  }
  return base_local._4_4_;
}

Assistant:

static int
epoll_apply_one_change(struct event_base *base,
    struct epollop *epollop,
    const struct event_change *ch)
{
	struct epoll_event epev;
	int op, events = 0;
	int idx;

	idx = EPOLL_OP_TABLE_INDEX(ch);
	op = epoll_op_table[idx].op;
	events = epoll_op_table[idx].events;

	if (!events) {
		EVUTIL_ASSERT(op == 0);
		return 0;
	}

	if ((ch->read_change|ch->write_change) & EV_CHANGE_ET)
		events |= EPOLLET;

	memset(&epev, 0, sizeof(epev));
	epev.data.fd = ch->fd;
	epev.events = events;
	if (epoll_ctl(epollop->epfd, op, ch->fd, &epev) == 0) {
		event_debug((PRINT_CHANGES(op, epev.events, ch, "okay")));
		return 0;
	}

	switch (op) {
	case EPOLL_CTL_MOD:
		if (errno == ENOENT) {
			/* If a MOD operation fails with ENOENT, the
			 * fd was probably closed and re-opened.  We
			 * should retry the operation as an ADD.
			 */
			if (epoll_ctl(epollop->epfd, EPOLL_CTL_ADD, ch->fd, &epev) == -1) {
				event_warn("Epoll MOD(%d) on %d retried as ADD; that failed too",
				    (int)epev.events, ch->fd);
				return -1;
			} else {
				event_debug(("Epoll MOD(%d) on %d retried as ADD; succeeded.",
					(int)epev.events,
					ch->fd));
				return 0;
			}
		}
		break;
	case EPOLL_CTL_ADD:
		if (errno == EEXIST) {
			/* If an ADD operation fails with EEXIST,
			 * either the operation was redundant (as with a
			 * precautionary add), or we ran into a fun
			 * kernel bug where using dup*() to duplicate the
			 * same file into the same fd gives you the same epitem
			 * rather than a fresh one.  For the second case,
			 * we must retry with MOD. */
			if (epoll_ctl(epollop->epfd, EPOLL_CTL_MOD, ch->fd, &epev) == -1) {
				event_warn("Epoll ADD(%d) on %d retried as MOD; that failed too",
				    (int)epev.events, ch->fd);
				return -1;
			} else {
				event_debug(("Epoll ADD(%d) on %d retried as MOD; succeeded.",
					(int)epev.events,
					ch->fd));
				return 0;
			}
		}
		break;
	case EPOLL_CTL_DEL:
		if (errno == ENOENT || errno == EBADF || errno == EPERM) {
			/* If a delete fails with one of these errors,
			 * that's fine too: we closed the fd before we
			 * got around to calling epoll_dispatch. */
			event_debug(("Epoll DEL(%d) on fd %d gave %s: DEL was unnecessary.",
				(int)epev.events,
				ch->fd,
				strerror(errno)));
			return 0;
		}
		break;
	default:
		break;
	}

	event_warn(PRINT_CHANGES(op, epev.events, ch, "failed"));
	return -1;
}